

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::tent_dist<float>::icdf(tent_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  float fVar2;
  result_type_conflict1 rVar3;
  
  if ((x < 0.0) || (1.0 < x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    rVar3 = NAN;
  }
  else if (0.5 <= x) {
    fVar2 = 2.0 - (x + x);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    rVar3 = (1.0 - fVar2) * (this->P).d_ + (this->P).m_;
  }
  else {
    fVar2 = x + x;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    rVar3 = (fVar2 + -1.0) * (this->P).d_ + (this->P).m_;
  }
  return rVar3;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return icdf_(x);
    }